

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * uniform_01_order_sample(int n,int *seed)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double dVar4;
  double *x;
  double v;
  double u;
  int i;
  int *seed_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  x = (double *)0x3ff0000000000000;
  for (u._4_4_ = n + -1; -1 < u._4_4_; u._4_4_ = u._4_4_ + -1) {
    dVar4 = r8_uniform_01(seed);
    dVar4 = pow(dVar4,1.0 / (double)(u._4_4_ + 1));
    x = (double *)((double)x * dVar4);
    pdVar3[u._4_4_] = (double)x;
  }
  return pdVar3;
}

Assistant:

double *uniform_01_order_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_01_ORDER_SAMPLE samples the Uniform 01 Order PDF.
//
//  Discussion:
//
//    In effect, this routine simply generates N samples of the
//    Uniform 01 PDF; but it generates them in order.  (Actually,
//    it generates them in descending order, but stores them in
//    the array in ascending order).  This saves the work of
//    sorting the results.  Moreover, if the order statistics
//    for another PDF are desired, and the inverse CDF is available,
//    then the desired values may be generated, presorted, by
//    calling this routine and using the results as input to the
//    inverse CDF routine.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    27 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Jerry Banks, editor,
//    Handbook of Simulation,
//    Engineering and Management Press Books, 1998, page 168.
//
//  Parameters:
//
//    Input, int N, the number of elements in the sample.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double UNIFORM_01_ORDER_SAMPLE[N], N samples of the Uniform 01 PDF, in
//    ascending order.
//
{
  int i;
  double u;
  double v;
  double *x;

  x = new double[n];

  v = 1.0;

  for ( i = n-1; 0 <= i; i-- )
  {
    u = r8_uniform_01 ( seed );
    v = v * pow ( u, 1.0 / static_cast<double>(i + 1 ) );
    x[i] = v;
  }

  return x;
}